

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O3

int Bdc_ManDecompose(Bdc_Man_t *p,uint *puFunc,uint *puCare,int nVars,Vec_Ptr_t *vDivs,int nNodesMax
                    )

{
  undefined4 uVar1;
  undefined4 uVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Bdc_Fun_t *pBVar5;
  ulong uVar6;
  long lVar7;
  Bdc_Isf_t *pIsf;
  uint uVar8;
  uint uVar9;
  Bdc_Isf_t Isf;
  timespec ts_1;
  Bdc_Isf_t local_68;
  long local_50;
  Vec_Ptr_t *local_48;
  timespec local_40;
  
  local_48 = vDivs;
  iVar4 = clock_gettime(3,(timespec *)&local_68);
  if (iVar4 < 0) {
    local_50 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_68.puOn),8);
    local_50 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68._0_8_ * -1000000;
  }
  if (p->pPars->nVarsMax < nVars) {
    __assert_fail("nVars <= p->pPars->nVarsMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                  ,0x127,
                  "int Bdc_ManDecompose(Bdc_Man_t *, unsigned int *, unsigned int *, int, Vec_Ptr_t *, int)"
                 );
  }
  p->nVars = nVars;
  uVar9 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar9 = 1;
  }
  p->nWords = uVar9;
  p->nNodesMax = nNodesMax;
  Bdc_ManPrepare(p,local_48);
  if (puCare == (uint *)0x0) {
    uVar9 = p->nWords;
    uVar6 = (ulong)uVar9;
    pVVar3 = p->vMemory;
    if (uVar6 != 0) {
      if ((int)uVar9 < 1) goto LAB_0054d442;
      lVar7 = (long)(int)uVar9 + (long)pVVar3->nSize;
      iVar4 = (int)lVar7;
      if (pVVar3->nCap < iVar4) {
        local_68.puOn = (uint *)0x0;
      }
      else {
        local_68.puOn = (uint *)(pVVar3->pArray + (lVar7 - uVar6));
      }
      iVar4 = iVar4 + uVar9;
      pVVar3->nSize = iVar4;
      if ((iVar4 <= pVVar3->nCap) &&
         (local_68.puOff = (uint *)(pVVar3->pArray + ((long)iVar4 - uVar6)),
         local_68.puOn != (uint *)0x0)) {
        iVar4 = p->nVars;
        uVar8 = 1 << ((char)iVar4 - 5U & 0x1f);
        uVar9 = uVar8;
        if (iVar4 < 6) {
          uVar9 = 1;
        }
        if (0 < (int)uVar9) {
          uVar6 = (ulong)uVar9 + 1;
          do {
            local_68.puOn[uVar6 - 2] = puFunc[uVar6 - 2];
            uVar6 = uVar6 - 1;
          } while (1 < uVar6);
          iVar4 = p->nVars;
          uVar8 = 1 << ((char)iVar4 - 5U & 0x1f);
        }
        if (iVar4 < 6) {
          uVar8 = 1;
        }
        if (0 < (int)uVar8) {
          uVar6 = (ulong)uVar8 + 1;
          do {
            local_68.puOff[uVar6 - 2] = ~puFunc[uVar6 - 2];
            uVar6 = uVar6 - 1;
          } while (1 < uVar6);
        }
        goto LAB_0054d331;
      }
    }
  }
  else {
    uVar6 = (ulong)uVar9;
    do {
      if ((int)uVar6 < 1) {
        p->pRoot = (Bdc_Fun_t *)((ulong)p->pNodes ^ 1);
        return 0;
      }
      lVar7 = uVar6 - 1;
      uVar6 = uVar6 - 1;
    } while (puCare[lVar7] == 0);
    uVar9 = p->nWords;
    uVar6 = (ulong)uVar9;
    pVVar3 = p->vMemory;
    if (uVar6 != 0) {
      if ((int)uVar9 < 1) {
LAB_0054d442:
        local_68.uSupp = 0;
        local_68.uUniq = 0;
        __assert_fail("nWords > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x39a,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
      }
      lVar7 = (long)(int)uVar9 + (long)pVVar3->nSize;
      iVar4 = (int)lVar7;
      if (pVVar3->nCap < iVar4) {
        local_68.puOn = (uint *)0x0;
      }
      else {
        local_68.puOn = (uint *)(pVVar3->pArray + (lVar7 - uVar6));
      }
      iVar4 = iVar4 + uVar9;
      pVVar3->nSize = iVar4;
      if ((iVar4 <= pVVar3->nCap) &&
         (local_68.puOff = (uint *)(pVVar3->pArray + ((long)iVar4 - uVar6)),
         local_68.puOn != (uint *)0x0)) {
        iVar4 = p->nVars;
        uVar8 = 1 << ((char)iVar4 - 5U & 0x1f);
        uVar9 = uVar8;
        if (iVar4 < 6) {
          uVar9 = 1;
        }
        if (0 < (int)uVar9) {
          uVar6 = (ulong)uVar9 + 1;
          do {
            local_68.puOn[uVar6 - 2] = puFunc[uVar6 - 2] & puCare[uVar6 - 2];
            uVar6 = uVar6 - 1;
          } while (1 < uVar6);
          iVar4 = p->nVars;
          uVar8 = 1 << ((char)iVar4 - 5U & 0x1f);
        }
        if (iVar4 < 6) {
          uVar8 = 1;
        }
        if (0 < (int)uVar8) {
          uVar6 = (ulong)uVar8 + 1;
          do {
            local_68.puOff[uVar6 - 2] = ~puFunc[uVar6 - 2] & puCare[uVar6 - 2];
            uVar6 = uVar6 - 1;
          } while (1 < uVar6);
        }
LAB_0054d331:
        local_68.uSupp = 0;
        local_68.uUniq = 0;
        Bdc_SuppMinimize(p,&local_68);
        pBVar5 = Bdc_ManDecompose_rec(p,&local_68);
        p->pRoot = pBVar5;
        iVar4 = clock_gettime(3,&local_40);
        if (iVar4 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        p->timeTotal = p->timeTotal + lVar7 + local_50;
        uVar1 = p->numCalls;
        uVar2 = p->numNodes;
        p->numCalls = uVar1 + 1;
        p->numNodes = p->nNodesNew + uVar2;
        if (p->pRoot == (Bdc_Fun_t *)0x0) {
          iVar4 = -1;
        }
        else {
          iVar4 = Bdc_ManNodeVerify(p,&local_68,p->pRoot);
          if (iVar4 == 0) {
            puts("Bdc_ManDecompose(): Internal verification failed.");
          }
          iVar4 = p->nNodesNew;
        }
        return iVar4;
      }
    }
  }
  local_68.uSupp = 0;
  local_68.uUniq = 0;
  __assert_fail("pF->puOff && pF->puOn",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcInt.h"
                ,0x83,"void Bdc_IsfStart(Bdc_Man_t *, Bdc_Isf_t *)");
}

Assistant:

int Bdc_ManDecompose( Bdc_Man_t * p, unsigned * puFunc, unsigned * puCare, int nVars, Vec_Ptr_t * vDivs, int nNodesMax )
{
    Bdc_Isf_t Isf, * pIsf = &Isf;
    abctime clk = Abc_Clock();
    assert( nVars <= p->pPars->nVarsMax );
    // set current manager parameters
    p->nVars = nVars;
    p->nWords = Kit_TruthWordNum( nVars );
    p->nNodesMax = nNodesMax;
    Bdc_ManPrepare( p, vDivs );
    if ( puCare && Kit_TruthIsConst0( puCare, nVars ) )
    {
        p->pRoot = Bdc_Not(p->pNodes);
        return 0;
    }
    // copy the function
    Bdc_IsfStart( p, pIsf );
    if ( puCare )
    {
        Kit_TruthAnd( pIsf->puOn, puCare, puFunc, p->nVars );
        Kit_TruthSharp( pIsf->puOff, puCare, puFunc, p->nVars );
    }
    else
    {
        Kit_TruthCopy( pIsf->puOn, puFunc, p->nVars );
        Kit_TruthNot( pIsf->puOff, puFunc, p->nVars );
    }
    Bdc_SuppMinimize( p, pIsf );
    // call decomposition
    p->pRoot = Bdc_ManDecompose_rec( p, pIsf );
    p->timeTotal += Abc_Clock() - clk;
    p->numCalls++;
    p->numNodes += p->nNodesNew;
    if ( p->pRoot == NULL )
        return -1;
    if ( !Bdc_ManNodeVerify( p, pIsf, p->pRoot ) )
        printf( "Bdc_ManDecompose(): Internal verification failed.\n" );
//    assert( Bdc_ManNodeVerify( p, pIsf, p->pRoot ) );
    return p->nNodesNew;
}